

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

tensor * __thiscall multi::forward(multi *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  double dVar1;
  size_type __new_size;
  tensor *this_00;
  reference pptVar2;
  reference pvVar3;
  vector<tensor_*,_std::allocator<tensor_*>_> *x_local;
  multi *this_local;
  
  (this->super_node).isbuild = true;
  __new_size = std::vector<tensor_*,_std::allocator<tensor_*>_>::size(x);
  std::vector<double,_std::allocator<double>_>::resize(&(this->super_node).grad_fn,__new_size);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  this_00 = (tensor *)operator_new(0x20);
  tensor::tensor(this_00,0.0,0.0,0);
  (this->super_node).ret = this_00;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  dVar1 = (*pptVar2)->data;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,1);
  ((this->super_node).ret)->data = dVar1 * (*pptVar2)->data;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,1);
  dVar1 = (*pptVar2)->data;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&(this->super_node).grad_fn,0);
  *pvVar3 = dVar1;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  dVar1 = (*pptVar2)->data;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&(this->super_node).grad_fn,1);
  *pvVar3 = dVar1;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  (*pptVar2)->cnt = (*pptVar2)->cnt + 1;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,0);
  (*pptVar2)->cnt_free = (*pptVar2)->cnt_free + 1;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,1);
  (*pptVar2)->cnt = (*pptVar2)->cnt + 1;
  pptVar2 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                      (&(this->super_node).input,1);
  (*pptVar2)->cnt_free = (*pptVar2)->cnt_free + 1;
  ((this->super_node).ret)->hook = &this->super_node;
  return (this->super_node).ret;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = input[0]->data*input[1]->data;
        grad_fn[0]=input[1]->data;
        grad_fn[1]=input[0]->data;
        input[0]->cnt++;
        input[0]->cnt_free++;
        input[1]->cnt++;
        input[1]->cnt_free++;
        ret->hook=this;
        return ret;
    }